

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
ArrayState<true>::Float(ArrayState<true> *this,Context<true> *ctx,float f)

{
  pointer pNVar1;
  feature_index i;
  ostream *poVar2;
  stringstream str;
  char local_1c0;
  undefined7 uStack_1bf;
  undefined1 local_1b0 [16];
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  local_1c0 = '[';
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_1c0,1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  local_1c0 = ']';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1c0,1);
  pNVar1 = (ctx->namespace_path).
           super__Vector_base<Namespace<true>,_std::allocator<Namespace<true>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  i = this->array_hash;
  std::__cxx11::stringbuf::str();
  Namespace<true>::AddFeature(pNVar1 + -1,f,i,(char *)CONCAT71(uStack_1bf,local_1c0));
  if ((undefined1 *)CONCAT71(uStack_1bf,local_1c0) != local_1b0) {
    operator_delete((undefined1 *)CONCAT71(uStack_1bf,local_1c0));
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  this->array_hash = this->array_hash + 1;
  return &this->super_BaseState<true>;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float f)
  {
    if (audit)
    {
      stringstream str;
      str << '[' << (array_hash - ctx.CurrentNamespace().namespace_hash) << ']';

      ctx.CurrentNamespace().AddFeature(f, array_hash, str.str().c_str());
    }
    else
      ctx.CurrentNamespace().AddFeature(f, array_hash, nullptr);
    array_hash++;

    return this;
  }